

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_CreateBoxTest(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *__ptr;
  void *__ptr_00;
  int iVar2;
  uint uVar3;
  Vec_Int_t *vAdds;
  Vec_Wec_t *pVVar4;
  Acec_Box_t *pBox;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  timespec ts;
  timespec local_50;
  Gia_Man_t *local_40;
  Vec_Wec_t *local_38;
  
  local_40 = p;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  vAdds = Ree_ManComputeCuts(local_40,(Vec_Int_t **)0x0,1);
  uVar3 = Ree_ManCountFadds(vAdds);
  printf("Detected %d adders (%d FAs and %d HAs).  ",(ulong)(uint)(vAdds->nSize / 6),(ulong)uVar3);
  iVar7 = 3;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  uVar3 = 0;
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar11 + lVar6) / 1000000.0);
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  pVVar4 = Acec_TreeFindTrees(local_40,vAdds,(Vec_Bit_t *)0x0,0,0);
  uVar1 = pVVar4->nSize;
  uVar12 = (ulong)(int)uVar1;
  if (0 < (long)uVar12) {
    lVar11 = 0;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + *(int *)((long)&pVVar4->pArray->nSize + lVar11);
      lVar11 = lVar11 + 0x10;
    } while (uVar12 << 4 != lVar11);
    uVar3 = iVar2 / 2;
  }
  printf("Collected %d trees with %d adders in them.  ",(ulong)uVar1,(ulong)uVar3);
  iVar7 = 3;
  iVar2 = clock_gettime(3,&local_50);
  if (iVar2 < 0) {
    lVar11 = -1;
  }
  else {
    lVar11 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(iVar7,"%s =","Time");
  Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar11 + lVar6) / 1000000.0);
  __ptr = pVVar4->pArray;
  local_38 = pVVar4;
  if (0 < (int)uVar1) {
    uVar13 = 0;
    do {
      pBox = Acec_CreateBox(local_40,vAdds,__ptr + uVar13);
      lVar6 = (long)pBox->vAdds->nSize;
      uVar5 = 0;
      if (0 < lVar6) {
        lVar11 = 0;
        uVar5 = 0;
        do {
          uVar5 = (ulong)(uint)((int)uVar5 + *(int *)((long)&pBox->vAdds->pArray->nSize + lVar11));
          lVar11 = lVar11 + 0x10;
        } while (lVar6 << 4 != lVar11);
      }
      lVar11 = (long)pBox->vLeafLits->nSize;
      uVar10 = 0;
      uVar9 = 0;
      if (0 < lVar11) {
        lVar8 = 0;
        uVar9 = 0;
        do {
          uVar9 = (ulong)(uint)((int)uVar9 + *(int *)((long)&pBox->vLeafLits->pArray->nSize + lVar8)
                               );
          lVar8 = lVar8 + 0x10;
        } while (lVar11 * 0x10 != lVar8);
      }
      lVar11 = (long)pBox->vRootLits->nSize;
      if (0 < lVar11) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          uVar10 = (ulong)(uint)((int)uVar10 +
                                *(int *)((long)&pBox->vRootLits->pArray->nSize + lVar8));
          lVar8 = lVar8 + 0x10;
        } while (lVar11 * 0x10 != lVar8);
      }
      printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",
             uVar13 & 0xffffffff,lVar6,uVar5,uVar9,uVar10);
      Acec_TreePrintBox(pBox,vAdds);
      if (pBox != (Acec_Box_t *)0x0) {
        Acec_BoxFree(pBox);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar12);
  }
  pVVar4 = local_38;
  iVar2 = local_38->nCap;
  if ((long)iVar2 < 1) {
    if (__ptr == (Vec_Int_t *)0x0) goto LAB_00682f4d;
  }
  else {
    lVar6 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr->pArray + lVar6);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        *(undefined8 *)((long)&__ptr->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar2 * 0x10 != lVar6);
  }
  free(__ptr);
LAB_00682f4d:
  free(pVVar4);
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
  }
  free(vAdds);
  return;
}

Assistant:

void Acec_CreateBoxTest( Gia_Man_t * p )
{
    Acec_Box_t * pBox;
    Vec_Wec_t * vTrees;
    Vec_Int_t * vTree;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int i, nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    //Vec_WecPrint( vTrees, 0 );

    Vec_WecForEachLevel( vTrees, vTree, i )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, i) );
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            i, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
        Acec_TreePrintBox( pBox, vAdds );
        Acec_BoxFreeP( &pBox );
    }

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}